

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::parse_args
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined8 *puVar1;
  Argument *this_00;
  bool bVar2;
  _Base_ptr p_Var3;
  pointer pMVar4;
  runtime_error *prVar5;
  Argument *this_01;
  long lVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string argument_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  parse_args_internal(this,arguments);
  for (p_Var3 = (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    Argument::validate((Argument *)&(p_Var3[1]._M_left)->_M_left);
  }
  pMVar4 = (this->m_mutually_exclusive_groups).
           super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pMVar4 == (this->m_mutually_exclusive_groups).
                  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    puVar1 = *(undefined8 **)(pMVar4 + 0x18);
    this_01 = (Argument *)0x0;
    bVar2 = false;
    for (puVar7 = *(undefined8 **)(pMVar4 + 0x10); puVar7 != puVar1; puVar7 = puVar7 + 1) {
      this_00 = (Argument *)*puVar7;
      if (bVar2) {
        if ((this_00->field_0x140 & 0x10) != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          Argument::get_usage_full_abi_cxx11_(&local_50,this_00);
          std::operator+(&local_90,"Argument \'",&local_50);
          std::operator+(&local_f0,&local_90,"\' not allowed with \'");
          Argument::get_usage_full_abi_cxx11_(&local_70,this_01);
          std::operator+(&local_d0,&local_f0,&local_70);
          std::operator+(&argument_names,&local_d0,"\'");
          std::runtime_error::runtime_error(prVar5,(string *)&argument_names);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else if ((this_00->field_0x140 & 0x10) != 0) {
        bVar2 = true;
        this_01 = this_00;
      }
    }
    if ((!bVar2) && (pMVar4[8] == (MutuallyExclusiveGroup)0x1)) break;
    pMVar4 = pMVar4 + 0x28;
  }
  argument_names._M_dataplus._M_p = (pointer)&argument_names.field_2;
  argument_names._M_string_length = 0;
  argument_names.field_2._M_local_buf[0] = '\0';
  puVar7 = *(undefined8 **)(pMVar4 + 0x10);
  lVar6 = (long)puVar1 - (long)puVar7 >> 3;
  for (; lVar6 = lVar6 + -1, puVar7 != puVar1; puVar7 = puVar7 + 1) {
    if (lVar6 == 0) {
      Argument::get_usage_full_abi_cxx11_(&local_90,(Argument *)*puVar7);
      std::operator+(&local_f0,"\'",&local_90);
      std::operator+(&local_d0,&local_f0,"\' ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&argument_names,&local_d0);
    }
    else {
      Argument::get_usage_full_abi_cxx11_(&local_90,(Argument *)*puVar7);
      std::operator+(&local_f0,"\'",&local_90);
      std::operator+(&local_d0,&local_f0,"\' or ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&argument_names,&local_d0);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_f0,"One of the arguments ",&argument_names);
  std::operator+(&local_d0,&local_f0,"is required");
  std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args(const std::vector<std::string> &arguments) {
    parse_args_internal(arguments);
    // Check if all arguments are parsed
    for ([[maybe_unused]] const auto &[unused, argument] : m_argument_map) {
      argument->validate();
    }

    // Check each mutually exclusive group and make sure
    // there are no constraint violations
    for (const auto &group : m_mutually_exclusive_groups) {
      auto mutex_argument_used{false};
      Argument *mutex_argument_it{nullptr};
      for (Argument *arg : group.m_elements) {
        if (!mutex_argument_used && arg->m_is_used) {
          mutex_argument_used = true;
          mutex_argument_it = arg;
        } else if (mutex_argument_used && arg->m_is_used) {
          // Violation
          throw std::runtime_error("Argument '" + arg->get_usage_full() +
                                   "' not allowed with '" +
                                   mutex_argument_it->get_usage_full() + "'");
        }
      }

      if (!mutex_argument_used && group.m_required) {
        // at least one argument from the group is
        // required
        std::string argument_names{};
        std::size_t i = 0;
        std::size_t size = group.m_elements.size();
        for (Argument *arg : group.m_elements) {
          if (i + 1 == size) {
            // last
            argument_names += "'" + arg->get_usage_full() + "' ";
          } else {
            argument_names += "'" + arg->get_usage_full() + "' or ";
          }
          i += 1;
        }
        throw std::runtime_error("One of the arguments " + argument_names +
                                 "is required");
      }
    }
  }